

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isLinearSampleResultValid
               (ConstPixelBufferAccess *level,Sampler *sampler,LookupPrecision *prec,float coordX,
               int coordY,Vec4 *result)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  deInt32 dVar5;
  TextureFormat *pTVar6;
  float fVar7;
  float fVar8;
  Vector<float,_2> local_94;
  undefined1 local_8c [8];
  Vec4 colorB;
  Vec4 colorA;
  float maxA;
  float minA;
  int x1;
  int x0;
  int i;
  TextureChannelClass texClass;
  TextureFormat format;
  int w;
  int maxI;
  int minI;
  Vec2 uBounds;
  Vec4 *result_local;
  int coordY_local;
  float coordX_local;
  LookupPrecision *prec_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *level_local;
  
  bVar1 = sampler->normalizedCoords;
  uBounds.m_data = (float  [2])result;
  iVar2 = ConstPixelBufferAccess::getWidth(level);
  iVar3 = Vector<int,_3>::x(&prec->coordBits);
  iVar4 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI,(bool)(bVar1 & 1),iVar2,coordX,iVar3,iVar4);
  fVar7 = Vector<float,_2>::x((Vector<float,_2> *)&maxI);
  x1 = deFloorFloatToInt32(fVar7 - 0.5);
  fVar7 = Vector<float,_2>::y((Vector<float,_2> *)&maxI);
  dVar5 = deFloorFloatToInt32(fVar7 - 0.5);
  iVar2 = ConstPixelBufferAccess::getWidth(level);
  pTVar6 = ConstPixelBufferAccess::getFormat(level);
  texClass = (*pTVar6).type;
  getTextureChannelClass(texClass);
  while( true ) {
    if (dVar5 < x1) {
      return false;
    }
    iVar3 = TexVerifierUtil::wrap(sampler->wrapS,x1,iVar2);
    iVar4 = TexVerifierUtil::wrap(sampler->wrapS,x1 + 1,iVar2);
    fVar7 = Vector<float,_2>::x((Vector<float,_2> *)&maxI);
    fVar7 = de::clamp<float>((fVar7 - 0.5) - (float)x1,0.0,1.0);
    fVar8 = Vector<float,_2>::y((Vector<float,_2> *)&maxI);
    fVar8 = de::clamp<float>((fVar8 - 0.5) - (float)x1,0.0,1.0);
    lookup<float>((tcu *)(colorB.m_data + 2),level,sampler,iVar3,coordY,0);
    lookup<float>((tcu *)local_8c,level,sampler,iVar4,coordY,0);
    Vector<float,_2>::Vector(&local_94,fVar7,fVar8);
    bVar1 = isLinearRangeValid(prec,(Vec4 *)(colorB.m_data + 2),(Vec4 *)local_8c,&local_94,
                               (Vec4 *)uBounds.m_data);
    if (bVar1) break;
    x1 = x1 + 1;
  }
  return true;
}

Assistant:

bool isLinearSampleResultValid (const ConstPixelBufferAccess&		level,
								const Sampler&						sampler,
								const LookupPrecision&				prec,
								const float							coordX,
								const int							coordY,
								const Vec4&							result)
{
	const Vec2					uBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(), coordX, prec.coordBits.x(), prec.uvwBits.x());

	const int					minI			= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int					maxI			= deFloorFloatToInt32(uBounds.y()-0.5f);

	const int					w				= level.getWidth();

	const TextureFormat			format			= level.getFormat();
	const TextureChannelClass	texClass		= getTextureChannelClass(format.type);

	DE_ASSERT(texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_FLOATING_POINT);
	DE_UNREF(texClass);
	DE_UNREF(format);

	for (int i = minI; i <= maxI; i++)
	{
		// Wrapped coordinates
		const int	x0		= wrap(sampler.wrapS, i  , w);
		const int	x1		= wrap(sampler.wrapS, i+1, w);

		// Bounds for filtering factors
		const float	minA	= de::clamp((uBounds.x()-0.5f)-float(i), 0.0f, 1.0f);
		const float	maxA	= de::clamp((uBounds.y()-0.5f)-float(i), 0.0f, 1.0f);

		const Vec4	colorA	= lookup<float>(level, sampler, x0, coordY, 0);
		const Vec4	colorB	= lookup<float>(level, sampler, x1, coordY, 0);

		if (isLinearRangeValid(prec, colorA, colorB, Vec2(minA, maxA), result))
			return true;
	}

	return false;
}